

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::InsertRectRec
          (ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode *a_node,
          ON_RTreeNode **a_newNode,int a_level)

{
  bool bVar1;
  ON_RTreeBBox local_110;
  ON_RTreeBBox local_e0;
  ON_RTreeBBox local_b0;
  ON_RTreeNode *local_80;
  ON_RTreeNode *otherNode;
  ON_RTreeBranch branch;
  int index;
  int a_level_local;
  ON_RTreeNode **a_newNode_local;
  ON_RTreeNode *a_node_local;
  ON__INT_PTR a_id_local;
  ON_RTreeBBox *a_rect_local;
  ON_RTree *this_local;
  
  branch.field_1.m_id._4_4_ = a_level;
  if (a_level < a_node->m_level) {
    branch.field_1.m_id._0_4_ = PickBranch(a_rect,a_node);
    if ((int)branch.field_1.m_id._0_4_ < 0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = InsertRectRec(this,a_rect,a_id,
                            a_node->m_branch[(int)branch.field_1.m_id._0_4_].field_1.m_child,
                            &local_80,branch.field_1.m_id._4_4_);
      if (bVar1) {
        NodeCover(&local_e0,a_node->m_branch[(int)branch.field_1.m_id._0_4_].field_1.m_child);
        memcpy(a_node->m_branch + (int)branch.field_1.m_id._0_4_,&local_e0,0x30);
        branch.m_rect.m_max[2] = (double)local_80;
        NodeCover(&local_110,local_80);
        memcpy(&otherNode,&local_110,0x30);
        this_local._7_1_ = AddBranch(this,(ON_RTreeBranch *)&otherNode,a_node,a_newNode);
      }
      else {
        CombineRectHelper(&local_b0,a_rect,&a_node->m_branch[(int)branch.field_1.m_id._0_4_].m_rect)
        ;
        memcpy(a_node->m_branch + (int)branch.field_1.m_id._0_4_,&local_b0,0x30);
        this_local._7_1_ = false;
      }
    }
  }
  else if (a_node->m_level == a_level) {
    memcpy(&otherNode,a_rect,0x30);
    branch.m_rect.m_max[2] = (double)a_id;
    this_local._7_1_ = AddBranch(this,(ON_RTreeBranch *)&otherNode,a_node,a_newNode);
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
               ,0xb03,"","ON_RTree::InsertRectRec - bug in algorithm");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::InsertRectRec(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode* a_node, ON_RTreeNode** a_newNode, int a_level)
{
  int index;
  ON_RTreeBranch branch;
  ON_RTreeNode* otherNode;

  // Still above level for insertion, go down tree recursively
  if(a_node->m_level > a_level)
  {
    index = PickBranch(a_rect, a_node);
    if ( index < 0 )
    {
      return false;
    }
    if (!InsertRectRec(a_rect, a_id, a_node->m_branch[index].m_child, &otherNode, a_level))
    {
      // Child was not split
      a_node->m_branch[index].m_rect = CombineRectHelper(a_rect, &(a_node->m_branch[index].m_rect));
      return false;
    }
    else // Child was split
    {
      a_node->m_branch[index].m_rect = NodeCover(a_node->m_branch[index].m_child);
      branch.m_child = otherNode;
      branch.m_rect = NodeCover(otherNode);
      return AddBranch(&branch, a_node, a_newNode);
    }
  }
  else if(a_node->m_level == a_level) // Have reached level for insertion. Add rect, split if necessary
  {
    branch.m_rect = *a_rect;

    // The (ON_RTreeNode*) cast is safe because ON__INT_PTR == sizeof(void*)
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_PUSH
// Disable warning C4312: 'type cast' : conversion from 'ON__INT_PTR' to 'ON_RTreeNode *' of greater size
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4312 )
#endif
    branch.m_child = (ON_RTreeNode*)a_id;
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_POP
#endif

    // Child field of leaves contains id of data record
    return AddBranch(&branch, a_node, a_newNode);
  }

  // We should never get here
  ON_ERROR("ON_RTree::InsertRectRec - bug in algorithm");
  return false;
}